

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_addsub(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  int opsize;
  TCGv_i32 pTVar1;
  TCGv_i32 ret;
  TCGv_i32 arg2;
  TCGv_i32 pTVar2;
  uint insn_00;
  undefined6 in_register_00000012;
  uint uVar3;
  bool bVar4;
  int iVar5;
  TCGv_i32 addr;
  
  insn_00 = (uint)CONCAT62(in_register_00000012,insn);
  tcg_ctx = s->uc->tcg_ctx;
  opsize = insn_opsize(insn_00);
  uVar3 = (uint)(CONCAT62(in_register_00000012,insn) >> 9) & 7;
  pTVar1 = gen_extend(s,tcg_ctx->cpu_dregs[uVar3],opsize,1);
  ret = tcg_temp_new_i32(tcg_ctx);
  bVar4 = (((s->base).tb)->flags & 0x2000) == 0;
  if ((insn_00 >> 8 & 1) == 0) {
    arg2 = gen_ea(env,s,insn,opsize,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,(uint)bVar4);
    if (arg2 == tcg_ctx->NULL_QREG) {
      gen_addr_fault(s);
      return;
    }
LAB_00678fd5:
    if ((insn_00 >> 0xe & 1) == 0) {
      tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_LTU,QREG_CC_X,pTVar1,arg2);
      tcg_gen_sub_i32(tcg_ctx,ret,pTVar1,arg2);
      iVar5 = 5;
    }
    else {
      tcg_gen_add_i32(tcg_ctx,ret,pTVar1,arg2);
      tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_LTU,QREG_CC_X,ret,arg2);
      iVar5 = 2;
    }
    set_cc_op(s,opsize + iVar5);
    gen_update_cc_add(tcg_ctx,ret,arg2,opsize);
    if ((insn_00 >> 8 & 1) == 0) {
      gen_partset_reg(tcg_ctx,opsize,tcg_ctx->cpu_dregs[uVar3],ret);
    }
    else {
      pTVar1 = gen_ea(env,s,insn,opsize,ret,&addr,EA_STORE,
                      (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
      if (pTVar1 == tcg_ctx->NULL_QREG) goto LAB_006790d4;
    }
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  }
  else {
    pTVar2 = gen_ea(env,s,insn,opsize,tcg_ctx->NULL_QREG,&addr,EA_LOADS,(uint)bVar4);
    arg2 = pTVar1;
    pTVar1 = pTVar2;
    if (pTVar2 != tcg_ctx->NULL_QREG) goto LAB_00678fd5;
LAB_006790d4:
    gen_addr_fault(s);
  }
  return;
}

Assistant:

DISAS_INSN(addsub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv dest;
    TCGv src;
    TCGv tmp;
    TCGv addr;
    int add;
    int opsize;

    add = (insn & 0x4000) != 0;
    opsize = insn_opsize(insn);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);
    dest = tcg_temp_new(tcg_ctx);
    if (insn & 0x100) {
        SRC_EA(env, tmp, opsize, 1, &addr);
        src = reg;
    } else {
        tmp = reg;
        SRC_EA(env, src, opsize, 1, NULL);
    }
    if (add) {
        tcg_gen_add_i32(tcg_ctx, dest, tmp, src);
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, dest, src);
        set_cc_op(s, CC_OP_ADDB + opsize);
    } else {
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_X, tmp, src);
        tcg_gen_sub_i32(tcg_ctx, dest, tmp, src);
        set_cc_op(s, CC_OP_SUBB + opsize);
    }
    gen_update_cc_add(tcg_ctx, dest, src, opsize);
    if (insn & 0x100) {
        DEST_EA(env, insn, opsize, dest, &addr);
    } else {
        gen_partset_reg(tcg_ctx, opsize, DREG(insn, 9), dest);
    }
    tcg_temp_free(tcg_ctx, dest);
}